

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O3

Logs * __thiscall
deqp::gles3::Performance::ShaderCompilerCase::getLogs
          (Logs *__return_storage_ptr__,ShaderCompilerCase *this,
          ShadersAndProgram *shadersAndProgram)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  undefined4 extraout_var;
  deUint32 dVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  int infoLogLen;
  string local_68;
  vector<char,_std::allocator<char>_> local_48;
  Performance *this_00;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  this_00 = (Performance *)CONCAT44(extraout_var,iVar3);
  (__return_storage_ptr__->vert)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->vert).field_2
  ;
  (__return_storage_ptr__->vert)._M_string_length = 0;
  (__return_storage_ptr__->vert).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->frag)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->frag).field_2
  ;
  (__return_storage_ptr__->frag)._M_string_length = 0;
  (__return_storage_ptr__->frag).field_2._M_local_buf[0] = '\0';
  paVar5 = &(__return_storage_ptr__->link).field_2;
  (__return_storage_ptr__->link)._M_dataplus._M_p = (pointer)paVar5;
  (__return_storage_ptr__->link)._M_string_length = 0;
  (__return_storage_ptr__->link).field_2._M_local_buf[0] = '\0';
  getShaderInfoLog_abi_cxx11_
            (&local_68,this_00,(Functions *)(ulong)shadersAndProgram->vertShader,(deUint32)paVar5);
  dVar4 = (deUint32)paVar5;
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
  paVar5 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar5) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  getShaderInfoLog_abi_cxx11_
            (&local_68,this_00,(Functions *)(ulong)shadersAndProgram->fragShader,dVar4);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->frag,(string *)&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar5) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  dVar4 = shadersAndProgram->program;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_68._M_dataplus._M_p = (pointer)paVar5;
  (**(code **)(this_00 + 0x9d8))(dVar4,0x8b84);
  std::vector<char,_std::allocator<char>_>::resize(&local_48,1);
  (**(code **)(this_00 + 0x988))
            (dVar4,1,0,
             local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  pcVar2 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  sVar1 = local_68._M_string_length;
  strlen(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start);
  std::__cxx11::string::_M_replace((ulong)&local_68,0,(char *)sVar1,(ulong)pcVar2);
  if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->link,(string *)&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar5) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

ShaderCompilerCase::Logs ShaderCompilerCase::getLogs (const ShadersAndProgram& shadersAndProgram) const
{
	const glw::Functions&	gl = m_context.getRenderContext().getFunctions();
	Logs					result;

	result.vert = getShaderInfoLog(gl, shadersAndProgram.vertShader);
	result.frag = getShaderInfoLog(gl, shadersAndProgram.fragShader);
	result.link = getProgramInfoLog(gl, shadersAndProgram.program);

	return result;
}